

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void filter_vert_chroma(uint8_t *u_dst,uint8_t *v_dst,int dst_stride,
                       AV1_DEBLOCKING_PARAMETERS *params,SequenceHeader *seq_params,
                       USE_FILTER_TYPE use_filter_type)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint8_t *in_RCX;
  int in_EDX;
  long in_RSI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  char in_R9B;
  uint16_t *v_dst_shortptr;
  uint16_t *u_dst_shortptr;
  aom_bit_depth_t bit_depth;
  int use_highbitdepth;
  loop_filter_thresh *v_limits;
  loop_filter_thresh *u_limits;
  undefined4 in_stack_00000088;
  int in_stack_000000a4;
  uint16_t *in_stack_000000a8;
  uint8_t *in_stack_000000b0;
  uint8_t *in_stack_000000b8;
  int in_stack_000000c4;
  uint8_t *in_stack_000000c8;
  uchar *in_stack_000000f8;
  uchar *in_stack_00000100;
  uchar *in_stack_00000108;
  int in_stack_00000114;
  uchar *in_stack_00000118;
  uint8_t *in_stack_00000120;
  uint8_t *in_stack_00000128;
  undefined4 in_stack_00000130;
  int in_stack_00000134;
  uint16_t *in_stack_00000138;
  uint8_t *in_stack_00000140;
  uint8_t *in_stack_00000148;
  int in_stack_00000154;
  uint16_t *in_stack_00000158;
  uint8_t *in_stack_00000160;
  uint8_t *in_stack_00000168;
  uint8_t *in_stack_00000170;
  uint8_t *in_stack_00000178;
  undefined4 in_stack_00000180;
  int in_stack_00000184;
  uint8_t *in_stack_00000188;
  uint8_t *in_stack_00000190;
  uint8_t *in_stack_00000198;
  int in_stack_000001a4;
  uint8_t *in_stack_000001a8;
  uint8_t *in_stack_00000b90;
  uint8_t *in_stack_00000b98;
  uint8_t *in_stack_000010e0;
  uint8_t *in_stack_000010e8;
  int in_stack_000010f0;
  uint8_t *in_stack_00001310;
  uint8_t *in_stack_00001318;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  
  puVar1 = *(uint8_t **)(in_RCX + 8);
  puVar2 = *(uint8_t **)(in_RCX + 8);
  iVar5 = *(int *)(in_R8 + 0x48);
  if (in_R8[0x4c] == '\0') {
    if (in_R9B == '\x02') {
      iVar5 = (int)((ulong)in_RSI >> 0x20);
      switch(*in_RCX) {
      case '\x04':
        aom_lpf_vertical_4_quad_sse2
                  (in_RDI,iVar5,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8);
        aom_lpf_vertical_4_quad_sse2
                  (in_RDI,(int)((ulong)in_RSI >> 0x20),
                   (uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8);
        break;
      case '\x06':
        aom_lpf_vertical_6_quad_sse2
                  (in_RDI,iVar5,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8);
        aom_lpf_vertical_6_quad_sse2
                  (in_RDI,(int)((ulong)in_RSI >> 0x20),
                   (uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8);
        break;
      case '\b':
      case '\x0e':
      default:
      }
    }
    else if (in_R9B == '\x01') {
      switch(*in_RCX) {
      case '\x04':
        aom_lpf_vertical_4_dual_sse2
                  (in_stack_000001a8,in_stack_000001a4,in_stack_00000198,in_stack_00000190,
                   in_stack_00000188,(uint8_t *)CONCAT44(in_stack_00000184,in_stack_00000180),
                   in_stack_00000b90,in_stack_00000b98);
        aom_lpf_vertical_4_dual_sse2
                  (in_stack_000001a8,in_stack_000001a4,in_stack_00000198,in_stack_00000190,
                   in_stack_00000188,(uint8_t *)CONCAT44(in_stack_00000184,in_stack_00000180),
                   in_stack_00000b90,in_stack_00000b98);
        break;
      case '\x06':
        aom_lpf_vertical_6_dual_sse2
                  (in_stack_00000188,in_stack_00000184,in_stack_00000178,in_stack_00000170,
                   in_stack_00000168,in_stack_00000160,in_stack_00001310,in_stack_00001318);
        aom_lpf_vertical_6_dual_sse2
                  (in_stack_00000188,in_stack_00000184,in_stack_00000178,in_stack_00000170,
                   in_stack_00000168,in_stack_00000160,in_stack_00001310,in_stack_00001318);
        break;
      case '\b':
      case '\x0e':
      default:
      }
    }
    else {
      switch(*in_RCX) {
      case '\x04':
        aom_lpf_vertical_4_sse2
                  (in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,in_stack_000000b0,
                   (uint8_t *)in_stack_000000a8);
        aom_lpf_vertical_4_sse2
                  (in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,in_stack_000000b0,
                   (uint8_t *)in_stack_000000a8);
        break;
      default:
        break;
      case '\x06':
        aom_lpf_vertical_6_sse2
                  (in_stack_00000118,in_stack_00000114,in_stack_00000108,in_stack_00000100,
                   in_stack_000000f8);
        aom_lpf_vertical_6_sse2
                  (in_stack_00000118,in_stack_00000114,in_stack_00000108,in_stack_00000100,
                   in_stack_000000f8);
        break;
      case '\b':
      case '\x0e':
      }
    }
  }
  else {
    puVar3 = (uint16_t *)((long)in_RDI * 2);
    puVar4 = (uint16_t *)(in_RSI * 2);
    if (in_R9B == '\x02') {
      switch(*in_RCX) {
      case '\x04':
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar3,in_EDX,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,puVar1 + 0x10,
                   puVar1 + 0x20,iVar5);
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar3 + (in_EDX << 3),in_EDX,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,
                   puVar1 + 0x10,puVar1 + 0x20,iVar5);
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar4,in_EDX,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar5);
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar4 + (in_EDX << 3),in_EDX,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,
                   puVar2 + 0x10,puVar2 + 0x20,iVar5);
        break;
      case '\x06':
        aom_highbd_lpf_vertical_6_dual_sse2
                  (in_stack_00000158,in_stack_00000154,in_stack_00000148,in_stack_00000140,
                   (uint8_t *)in_stack_00000138,
                   (uint8_t *)CONCAT44(in_stack_00000134,in_stack_00000130),in_stack_000010e0,
                   in_stack_000010e8,in_stack_000010f0);
        aom_highbd_lpf_vertical_6_dual_sse2
                  (in_stack_00000158,in_stack_00000154,in_stack_00000148,in_stack_00000140,
                   (uint8_t *)in_stack_00000138,
                   (uint8_t *)CONCAT44(in_stack_00000134,in_stack_00000130),in_stack_000010e0,
                   in_stack_000010e8,in_stack_000010f0);
        aom_highbd_lpf_vertical_6_dual_sse2
                  (in_stack_00000158,in_stack_00000154,in_stack_00000148,in_stack_00000140,
                   (uint8_t *)in_stack_00000138,
                   (uint8_t *)CONCAT44(in_stack_00000134,in_stack_00000130),in_stack_000010e0,
                   in_stack_000010e8,in_stack_000010f0);
        aom_highbd_lpf_vertical_6_dual_sse2
                  (in_stack_00000158,in_stack_00000154,in_stack_00000148,in_stack_00000140,
                   (uint8_t *)in_stack_00000138,
                   (uint8_t *)CONCAT44(in_stack_00000134,in_stack_00000130),in_stack_000010e0,
                   in_stack_000010e8,in_stack_000010f0);
        break;
      case '\b':
      case '\x0e':
      default:
      }
    }
    else if (in_R9B == '\x01') {
      switch(*in_RCX) {
      case '\x04':
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar3,in_EDX,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,puVar1 + 0x10,
                   puVar1 + 0x20,iVar5);
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar4,in_EDX,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar5);
        break;
      case '\x06':
        aom_highbd_lpf_vertical_6_dual_sse2
                  (in_stack_00000158,in_stack_00000154,in_stack_00000148,in_stack_00000140,
                   (uint8_t *)in_stack_00000138,
                   (uint8_t *)CONCAT44(in_stack_00000134,in_stack_00000130),in_stack_000010e0,
                   in_stack_000010e8,in_stack_000010f0);
        aom_highbd_lpf_vertical_6_dual_sse2
                  (in_stack_00000158,in_stack_00000154,in_stack_00000148,in_stack_00000140,
                   (uint8_t *)in_stack_00000138,
                   (uint8_t *)CONCAT44(in_stack_00000134,in_stack_00000130),in_stack_000010e0,
                   in_stack_000010e8,in_stack_000010f0);
        break;
      case '\b':
      case '\x0e':
      default:
      }
    }
    else {
      switch(*in_RCX) {
      case '\x04':
        aom_highbd_lpf_vertical_4_sse2
                  (in_stack_000000a8,in_stack_000000a4,u_dst,v_dst,
                   (uint8_t *)CONCAT44(dst_stride,in_stack_00000088),params._4_4_);
        aom_highbd_lpf_vertical_4_sse2
                  (in_stack_000000a8,in_stack_000000a4,u_dst,v_dst,
                   (uint8_t *)CONCAT44(dst_stride,in_stack_00000088),params._4_4_);
        break;
      default:
        break;
      case '\x06':
        aom_highbd_lpf_vertical_6_sse2
                  (in_stack_00000138,in_stack_00000134,in_stack_00000128,in_stack_00000120,
                   in_stack_00000118,in_stack_00000114);
        aom_highbd_lpf_vertical_6_sse2
                  (in_stack_00000138,in_stack_00000134,in_stack_00000128,in_stack_00000120,
                   in_stack_00000118,in_stack_00000114);
        break;
      case '\b':
      case '\x0e':
      }
    }
  }
  return;
}

Assistant:

static inline void filter_vert_chroma(uint8_t *u_dst, uint8_t *v_dst,
                                      int dst_stride,
                                      const AV1_DEBLOCKING_PARAMETERS *params,
                                      const SequenceHeader *seq_params,
                                      USE_FILTER_TYPE use_filter_type) {
  const loop_filter_thresh *u_limits = params->lfthr;
  const loop_filter_thresh *v_limits = params->lfthr;
#if CONFIG_AV1_HIGHBITDEPTH
  const int use_highbitdepth = seq_params->use_highbitdepth;
  const aom_bit_depth_t bit_depth = seq_params->bit_depth;
  if (use_highbitdepth) {
    uint16_t *u_dst_shortptr = CONVERT_TO_SHORTPTR(u_dst);
    uint16_t *v_dst_shortptr = CONVERT_TO_SHORTPTR(v_dst);
    if (use_filter_type == USE_QUAD) {
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_vertical_4_dual(
              u_dst_shortptr, dst_stride, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_vertical_4_dual(
              u_dst_shortptr + (2 * MI_SIZE * dst_stride), dst_stride,
              u_limits->mblim, u_limits->lim, u_limits->hev_thr,
              u_limits->mblim, u_limits->lim, u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_vertical_4_dual(
              v_dst_shortptr, dst_stride, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          aom_highbd_lpf_vertical_4_dual(
              v_dst_shortptr + (2 * MI_SIZE * dst_stride), dst_stride,
              v_limits->mblim, v_limits->lim, v_limits->hev_thr,
              v_limits->mblim, v_limits->lim, v_limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_vertical_6_dual(
              u_dst_shortptr, dst_stride, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_vertical_6_dual(
              u_dst_shortptr + (2 * MI_SIZE * dst_stride), dst_stride,
              u_limits->mblim, u_limits->lim, u_limits->hev_thr,
              u_limits->mblim, u_limits->lim, u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_vertical_6_dual(
              v_dst_shortptr, dst_stride, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          aom_highbd_lpf_vertical_6_dual(
              v_dst_shortptr + (2 * MI_SIZE * dst_stride), dst_stride,
              v_limits->mblim, v_limits->lim, v_limits->hev_thr,
              v_limits->mblim, v_limits->lim, v_limits->hev_thr, bit_depth);
          break;
        case 8:
        case 14: assert(0);
        // no filtering
        default: break;
      }
    } else if (use_filter_type == USE_DUAL) {
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_vertical_4_dual(
              u_dst_shortptr, dst_stride, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_vertical_4_dual(
              v_dst_shortptr, dst_stride, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_vertical_6_dual(
              u_dst_shortptr, dst_stride, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_vertical_6_dual(
              v_dst_shortptr, dst_stride, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          break;
        case 8:
        case 14: assert(0);
        // no filtering
        default: break;
      }
    } else {
      assert(use_filter_type == USE_SINGLE);
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_vertical_4(u_dst_shortptr, dst_stride, u_limits->mblim,
                                    u_limits->lim, u_limits->hev_thr,
                                    bit_depth);
          aom_highbd_lpf_vertical_4(v_dst_shortptr, dst_stride, v_limits->mblim,
                                    v_limits->lim, v_limits->hev_thr,
                                    bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_vertical_6(u_dst_shortptr, dst_stride, u_limits->mblim,
                                    u_limits->lim, u_limits->hev_thr,
                                    bit_depth);
          aom_highbd_lpf_vertical_6(v_dst_shortptr, dst_stride, v_limits->mblim,
                                    v_limits->lim, v_limits->hev_thr,
                                    bit_depth);
          break;
        case 8:
        case 14: assert(0); break;
        // no filtering
        default: break;
      }
    }
    return;
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  if (use_filter_type == USE_QUAD) {
    // Only one set of loop filter parameters (mblim, lim and hev_thr) is
    // passed as argument to quad loop filter because quad loop filter is
    // called for those cases where all the 4 set of loop filter parameters
    // are equal.
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_vertical_4_quad(u_dst, dst_stride, u_limits->mblim,
                                u_limits->lim, u_limits->hev_thr);
        aom_lpf_vertical_4_quad(v_dst, dst_stride, v_limits->mblim,
                                v_limits->lim, v_limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_vertical_6_quad(u_dst, dst_stride, u_limits->mblim,
                                u_limits->lim, u_limits->hev_thr);
        aom_lpf_vertical_6_quad(v_dst, dst_stride, v_limits->mblim,
                                v_limits->lim, v_limits->hev_thr);
        break;
      case 8:
      case 14: assert(0);
      // no filtering
      default: break;
    }
  } else if (use_filter_type == USE_DUAL) {
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_vertical_4_dual(u_dst, dst_stride, u_limits->mblim,
                                u_limits->lim, u_limits->hev_thr,
                                u_limits->mblim, u_limits->lim,
                                u_limits->hev_thr);
        aom_lpf_vertical_4_dual(v_dst, dst_stride, v_limits->mblim,
                                v_limits->lim, v_limits->hev_thr,
                                v_limits->mblim, v_limits->lim,
                                v_limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_vertical_6_dual(u_dst, dst_stride, u_limits->mblim,
                                u_limits->lim, u_limits->hev_thr,
                                u_limits->mblim, u_limits->lim,
                                u_limits->hev_thr);
        aom_lpf_vertical_6_dual(v_dst, dst_stride, v_limits->mblim,
                                v_limits->lim, v_limits->hev_thr,
                                v_limits->mblim, v_limits->lim,
                                v_limits->hev_thr);
        break;
      case 8:
      case 14: assert(0);
      // no filtering
      default: break;
    }
  } else {
    assert(use_filter_type == USE_SINGLE);
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_vertical_4(u_dst, dst_stride, u_limits->mblim, u_limits->lim,
                           u_limits->hev_thr);
        aom_lpf_vertical_4(v_dst, dst_stride, v_limits->mblim, v_limits->lim,
                           u_limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_vertical_6(u_dst, dst_stride, u_limits->mblim, u_limits->lim,
                           u_limits->hev_thr);
        aom_lpf_vertical_6(v_dst, dst_stride, v_limits->mblim, v_limits->lim,
                           v_limits->hev_thr);
        break;
      case 8:
      case 14: assert(0); break;
      // no filtering
      default: break;
    }
  }
#if !CONFIG_AV1_HIGHBITDEPTH
  (void)seq_params;
#endif  // !CONFIG_AV1_HIGHBITDEPTH
}